

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O1

KeyValues * __thiscall KV::KeyValues::createKey(KeyValues *this,string_view *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  KeyValues *pKVar2;
  iterator iVar3;
  _Rb_tree_header *p_Var4;
  __uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>_>
  local_50;
  
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,name->_M_str,name->_M_str + name->_M_len);
  local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
  _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
  super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl =
       (__uniq_ptr_data<KV::KeyValues,_std::default_delete<KV::KeyValues>,_true,_true>)
       operator_new(0x70);
  p_Var4 = &(((KeyValues *)
             local_50.second._M_t.
             super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>._M_t.
             super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
             super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->keyvalues)._M_t._M_impl.
            super__Rb_tree_header;
  (((KeyValues *)
   local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
   _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
   super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->keyvalues)._M_t._M_impl.
  super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (((KeyValues *)
   local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
   _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
   super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->keyvalues)._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (((KeyValues *)
   local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
   _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
   super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->keyvalues)._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (((KeyValues *)
   local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
   _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
   super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->keyvalues)._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)
   &(((KeyValues *)
     local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
     _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
     super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->keyvalues)._M_t._M_impl = 0;
  *(undefined8 *)
   &(((KeyValues *)
     local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
     _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
     super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->keyvalues)._M_t._M_impl.
    super__Rb_tree_header._M_header = 0;
  ((KeyValues *)
  local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
  _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
  super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->parentKV = (KeyValues *)0x0;
  ((KeyValues *)
  local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
  _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
  super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->depth = 0;
  *(undefined8 *)
   ((long)&(((KeyValues *)
            local_50.second._M_t.
            super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>._M_t.
            super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
            super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->value).
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x18) = 0;
  *(undefined8 *)
   &(((KeyValues *)
     local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
     _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
     super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->value).
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = 0;
  (((KeyValues *)
   local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
   _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
   super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->value).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = 0;
  *(undefined8 *)
   ((long)&(((KeyValues *)
            local_50.second._M_t.
            super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>._M_t.
            super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
            super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->value).
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload + 0x10) = 0;
  ((KeyValues *)
  local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
  _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
  super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->key = (string *)0x0;
  (((KeyValues *)
   local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
   _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
   super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->value).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (pointer)0x0;
  (((KeyValues *)
   local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
   _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
   super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->keyvalues)._M_t._M_impl.
  super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  (((KeyValues *)
   local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
   _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
   super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->keyvalues)._M_t._M_impl.
  super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  (((KeyValues *)
   local_50.second._M_t.super___uniq_ptr_impl<KV::KeyValues,_std::default_delete<KV::KeyValues>_>.
   _M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
   super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl)->keyvalues)._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  paVar1 = &local_50.first.field_2;
  if (local_70 == &local_60) {
    local_50.first.field_2._8_8_ = local_60._8_8_;
    local_50.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_50.first._M_dataplus._M_p = (pointer)local_70;
  }
  local_50.first.field_2._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
  local_50.first.field_2._M_local_buf[0] = local_60._M_local_buf[0];
  local_50.first._M_string_length = local_68;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_78._M_t.super__Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>.
  super__Head_base<0UL,_KV::KeyValues_*,_false>._M_head_impl =
       (tuple<KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>)
       (_Tuple_impl<0UL,_KV::KeyValues_*,_std::default_delete<KV::KeyValues>_>)0x0;
  local_70 = &local_60;
  iVar3 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>,KV::KeyValues::kvCompare,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>>
          ::
          _M_emplace_equal<std::pair<std::__cxx11::string,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>,KV::KeyValues::kvCompare,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<KV::KeyValues,std::default_delete<KV::KeyValues>>>>>
                      *)&this->keyvalues,&local_50);
  std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>::~unique_ptr(&local_50.second)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  std::unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_>::~unique_ptr
            ((unique_ptr<KV::KeyValues,_std::default_delete<KV::KeyValues>_> *)&local_78);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0])
                             + 1);
  }
  pKVar2 = *(KeyValues **)(iVar3._M_node + 2);
  pKVar2->key = (string *)(iVar3._M_node + 1);
  pKVar2->parentKV = this;
  if (this->parentKV != (KeyValues *)0x0) {
    pKVar2->depth = this->depth + 1;
  }
  return pKVar2;
}

Assistant:

KeyValues &KeyValues::createKey( const std::string_view &name )
	{
		auto it = keyvalues.insert( std::make_pair( std::string( name ), std::make_unique< KeyValues >() ) );
		KeyValues &kv = *it->second;
		kv.key = &it->first;
		kv.parentKV = this;

		if ( !isRoot() )
			kv.depth = depth + 1;

		return kv;
	}